

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxmlparser.cpp
# Opt level: O1

char * TiXmlBase::SkipWhiteSpace(char *p,TiXmlEncoding encoding)

{
  byte *pbVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  byte bVar5;
  
  if ((p == (char *)0x0) || (*p == '\0')) {
    p = (char *)0x0;
  }
  else if (encoding == TIXML_ENCODING_UTF8) {
    do {
      bVar5 = *p;
      uVar4 = (uint)bVar5;
      if (bVar5 == 0xef) {
        if ((((byte *)p)[1] != 0xbb) || (((byte *)p)[2] != 0xbf)) goto LAB_0010f1d9;
LAB_0010f201:
        p = (char *)((byte *)p + 3);
        bVar2 = false;
      }
      else {
        if (bVar5 == 0) {
          return (char *)(byte *)p;
        }
LAB_0010f1d9:
        if ((uVar4 == 0xef) &&
           (((((byte *)p)[1] == 0xbf && (((byte *)p)[2] == 0xbe)) ||
            ((((byte *)p)[1] == 0xbf && (((byte *)p)[2] == 0xbf)))))) goto LAB_0010f201;
        iVar3 = isspace(uVar4);
        p = (char *)((byte *)p + ((uVar4 == 0xd || uVar4 == 10) || iVar3 != 0));
        bVar2 = (uVar4 != 0xd && uVar4 != 10) && iVar3 == 0;
      }
    } while (!bVar2);
  }
  else {
    bVar5 = *p;
    while (bVar5 != 0) {
      iVar3 = isspace((uint)bVar5);
      if (((iVar3 == 0) && (bVar5 != 0xd)) && (bVar5 != 10)) {
        return (char *)(byte *)p;
      }
      pbVar1 = (byte *)p + 1;
      p = (char *)((byte *)p + 1);
      bVar5 = *pbVar1;
    }
  }
  return (char *)(byte *)p;
}

Assistant:

const char* TiXmlBase::SkipWhiteSpace( const char* p, TiXmlEncoding encoding )
{
	if ( !p || !*p )
	{
		return 0;
	}
	if ( encoding == TIXML_ENCODING_UTF8 )
	{
		while ( *p )
		{
			const unsigned char* pU = (const unsigned char*)p;
			
			// Skip the stupid Microsoft UTF-8 Byte order marks
			if (	*(pU+0)==TIXML_UTF_LEAD_0
				 && *(pU+1)==TIXML_UTF_LEAD_1 
				 && *(pU+2)==TIXML_UTF_LEAD_2 )
			{
				p += 3;
				continue;
			}
			else if(*(pU+0)==TIXML_UTF_LEAD_0
				 && *(pU+1)==0xbfU
				 && *(pU+2)==0xbeU )
			{
				p += 3;
				continue;
			}
			else if(*(pU+0)==TIXML_UTF_LEAD_0
				 && *(pU+1)==0xbfU
				 && *(pU+2)==0xbfU )
			{
				p += 3;
				continue;
			}

			if ( IsWhiteSpace( *p ) )		// Still using old rules for white space.
				++p;
			else
				break;
		}
	}
	else
	{
		while ( *p && IsWhiteSpace( *p ) )
			++p;
	}

	return p;
}